

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

vm_obj_id_t CVmObjIterLookupTable::create_for_coll(vm_val_t *coll)

{
  vm_obj_id_t vVar1;
  vm_val_t *in_RDI;
  vm_obj_id_t id;
  undefined4 in_stack_ffffffffffffffe8;
  vm_obj_id_t in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  CVmStack::push(in_RDI);
  vVar1 = vm_new_id(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  CVmObject::operator_new(CONCAT44(vVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  CVmObjIterLookupTable
            ((CVmObjIterLookupTable *)CONCAT44(vVar1,in_stack_fffffffffffffff0),
             (vm_val_t *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  CVmStack::discard();
  return vVar1;
}

Assistant:

vm_obj_id_t CVmObjIterLookupTable::create_for_coll(VMG_ const vm_val_t *coll)
{
    vm_obj_id_t id;

    /* push the collection object reference for gc protection */
    G_stk->push(coll);

    /* create a non-root-set object */
    id = vm_new_id(vmg_ FALSE, TRUE, TRUE);

    /* instantiate the iterator */
    new (vmg_ id) CVmObjIterLookupTable(vmg_ coll);

    /* done with the gc protection */
    G_stk->discard();

    /* return the new object's ID */
    return id;
}